

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>::
reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,error_code *ec)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  undefined4 uStack_2e;
  ushort uStack_2a;
  
  puVar1 = (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x18) = puVar1;
  *(pointer *)(this + 0x20) = puVar1;
  *(pointer *)(this + 0x28) = puVar2;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset
            ((basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(this + 8));
  *(undefined2 *)(this + 0xc0) = 3;
  *(undefined4 *)(this + 0xc2) = uStack_2e;
  *(uint *)(this + 0xc6) = (uint)uStack_2a;
  *(undefined4 *)(this + 0xca) = 0;
  *(undefined4 *)(this + 0xce) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined4 *)(this + 0xe0) = 0;
  *(undefined4 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  *(undefined8 *)(this + 0x109) = 0;
  *(undefined8 *)(this + 0x111) = 0;
  cVar3 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar3 != '\0') {
    return;
  }
  (**(code **)(*(long *)this + 0x40))(this,ec);
  return;
}

Assistant:

void reset(Sourceable&& source, std::error_code& ec)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        eof_ = false;
        if (!done())
        {
            next(ec);
        }
    }